

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  short *psVar1;
  uchar uVar2;
  short sVar3;
  ushort uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  float fVar9;
  StbUndoRecord *pSVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  int temp;
  int iVar13;
  int iVar14;
  ImWchar *pIVar15;
  unsigned_short *puVar16;
  int *piVar17;
  int temp_1;
  int iVar18;
  ImGuiStb *pIVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  float *pfVar26;
  ImFont *in_R8;
  int iVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  StbFindState find;
  ImWchar *local_60;
  float local_54;
  ImGuiStb *local_50;
  ImWchar local_48 [6];
  int local_3c;
  int local_38;
  int local_34;
  
  state = &this->StbState;
  local_50 = (ImGuiStb *)&(this->StbState).preferred_x;
  do {
    switch(key) {
    case 0x10000:
      iVar14 = (this->StbState).select_start;
      iVar18 = (this->StbState).select_end;
      if (iVar14 == iVar18) {
        if (0 < state->cursor) {
          state->cursor = state->cursor + -1;
        }
      }
      else {
        if (iVar18 < iVar14) {
          (this->StbState).select_end = iVar14;
          (this->StbState).select_start = iVar18;
        }
        iVar14 = (this->StbState).select_start;
        (this->StbState).cursor = iVar14;
        (this->StbState).select_end = iVar14;
        (this->StbState).has_preferred_x = '\0';
      }
      goto LAB_00144b8b;
    case 0x10001:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        state->cursor = state->cursor + 1;
      }
      else {
        ImGuiStb::stb_textedit_move_to_last(this,state);
      }
      ImGuiStb::stb_textedit_clamp(this,state);
      goto LAB_00144b8b;
    case 0x10002:
switchD_001441d3_caseD_10002:
      uVar22 = key & 0x20000;
      uVar2 = (this->StbState).single_line;
      if (uVar2 == '\0') {
        iVar14 = (this->StbState).select_start;
        iVar18 = (this->StbState).select_end;
        if (uVar22 == 0) {
          if (iVar14 != iVar18) {
            if (iVar18 < iVar14) {
              (this->StbState).select_end = iVar14;
              (this->StbState).select_start = iVar18;
            }
            iVar14 = (this->StbState).select_start;
            (this->StbState).cursor = iVar14;
            (this->StbState).select_end = iVar14;
            (this->StbState).has_preferred_x = '\0';
          }
        }
        else if (iVar14 == iVar18) {
          iVar14 = (this->StbState).cursor;
          (this->StbState).select_end = iVar14;
          (this->StbState).select_start = iVar14;
        }
        else {
          state->cursor = iVar18;
        }
        ImGuiStb::stb_textedit_clamp(this,state);
        ImGuiStb::stb_textedit_find_charpos
                  ((ImGuiStb *)local_48,(StbFindState *)this,
                   (ImGuiInputTextState *)(ulong)(uint)(this->StbState).cursor,
                   (uint)(this->StbState).single_line,(int)in_R8);
        if (local_34 != local_3c) {
          pIVar19 = local_50;
          if ((this->StbState).has_preferred_x == '\0') {
            pIVar19 = (ImGuiStb *)local_48;
          }
          lVar20 = (long)local_34;
          local_54 = *(float *)pIVar19;
          (this->StbState).cursor = local_34;
          puVar16 = (this->TextW).Data;
          local_60 = (ImWchar *)0x0;
          pIVar15 = puVar16 + lVar20;
          InputTextCalcTextSizeW
                    (pIVar15,puVar16 + this->CurLenW,&local_60,(ImVec2 *)0x1,SUB81(in_R8,0));
          pIVar11 = GImGui;
          uVar28 = (uint)((ulong)((long)local_60 - (long)pIVar15) >> 1);
          if (0 < (int)uVar28) {
            puVar16 = (this->TextW).Data;
            iVar14 = (this->StbState).cursor;
            fVar29 = 0.0;
            uVar25 = 1;
            do {
              uVar4 = puVar16[lVar20 + (uVar25 - 1)];
              fVar30 = -1.0;
              if (uVar4 != 10) {
                in_R8 = pIVar11->Font;
                pfVar26 = &in_R8->FallbackAdvanceX;
                if ((int)(uint)uVar4 < (in_R8->IndexAdvanceX).Size) {
                  pfVar26 = (float *)((ulong)((uint)uVar4 * 4) + (long)(in_R8->IndexAdvanceX).Data);
                }
                fVar30 = (pIVar11->FontSize / in_R8->FontSize) * *pfVar26;
              }
              if (((fVar30 == -1.0) && (!NAN(fVar30))) ||
                 (fVar29 = fVar29 + fVar30, local_54 < fVar29)) {
                bVar12 = false;
              }
              else {
                iVar14 = iVar14 + 1;
                state->cursor = iVar14;
                bVar12 = true;
              }
            } while ((bVar12) &&
                    (bVar12 = uVar25 < (uVar28 & 0x7fffffff), uVar25 = uVar25 + 1, bVar12));
          }
          ImGuiStb::stb_textedit_clamp(this,state);
          (this->StbState).has_preferred_x = '\x01';
          (this->StbState).preferred_x = local_54;
          if (uVar22 != 0) {
            (this->StbState).select_end = (this->StbState).cursor;
          }
        }
      }
      else {
        key = uVar22 | 0x10000;
      }
      break;
    case 0x10003:
switchD_001441d3_caseD_10003:
      uVar22 = key & 0x20000;
      uVar2 = (this->StbState).single_line;
      if (uVar2 == '\0') {
        iVar14 = (this->StbState).select_start;
        iVar18 = (this->StbState).select_end;
        if (uVar22 == 0) {
          if (iVar14 != iVar18) {
            ImGuiStb::stb_textedit_move_to_last(this,state);
          }
        }
        else if (iVar14 == iVar18) {
          iVar14 = (this->StbState).cursor;
          (this->StbState).select_end = iVar14;
          (this->StbState).select_start = iVar14;
        }
        else {
          state->cursor = iVar18;
        }
        ImGuiStb::stb_textedit_clamp(this,state);
        ImGuiStb::stb_textedit_find_charpos
                  ((ImGuiStb *)local_48,(StbFindState *)this,
                   (ImGuiInputTextState *)(ulong)(uint)(this->StbState).cursor,
                   (uint)(this->StbState).single_line,(int)in_R8);
        if ((long)local_38 != 0) {
          pIVar19 = local_50;
          if ((this->StbState).has_preferred_x == '\0') {
            pIVar19 = (ImGuiStb *)local_48;
          }
          fVar29 = *(float *)pIVar19;
          lVar20 = (long)local_3c + (long)local_38;
          (this->StbState).cursor = (int)lVar20;
          puVar16 = (this->TextW).Data;
          local_60 = (ImWchar *)0x0;
          pIVar15 = puVar16 + lVar20;
          InputTextCalcTextSizeW
                    (pIVar15,puVar16 + this->CurLenW,&local_60,(ImVec2 *)0x1,SUB81(in_R8,0));
          pIVar11 = GImGui;
          uVar28 = (uint)((ulong)((long)local_60 - (long)pIVar15) >> 1);
          if (0 < (int)uVar28) {
            puVar16 = (this->TextW).Data;
            iVar14 = (this->StbState).cursor;
            fVar30 = 0.0;
            uVar25 = 1;
            do {
              uVar4 = puVar16[lVar20 + (uVar25 - 1)];
              fVar9 = -1.0;
              if (uVar4 != 10) {
                in_R8 = pIVar11->Font;
                pfVar26 = &in_R8->FallbackAdvanceX;
                if ((int)(uint)uVar4 < (in_R8->IndexAdvanceX).Size) {
                  pfVar26 = (float *)((ulong)((uint)uVar4 * 4) + (long)(in_R8->IndexAdvanceX).Data);
                }
                fVar9 = (pIVar11->FontSize / in_R8->FontSize) * *pfVar26;
              }
              if (((fVar9 == -1.0) && (!NAN(fVar9))) || (fVar30 = fVar30 + fVar9, fVar29 < fVar30))
              {
                bVar12 = false;
              }
              else {
                iVar14 = iVar14 + 1;
                state->cursor = iVar14;
                bVar12 = true;
              }
            } while ((bVar12) &&
                    (bVar12 = uVar25 < (uVar28 & 0x7fffffff), uVar25 = uVar25 + 1, bVar12));
          }
          ImGuiStb::stb_textedit_clamp(this,state);
          (this->StbState).has_preferred_x = '\x01';
          (this->StbState).preferred_x = fVar29;
          if (uVar22 != 0) {
            (this->StbState).select_end = (this->StbState).cursor;
          }
        }
      }
      else {
        key = uVar22 | 0x10001;
      }
      break;
    case 0x10004:
      ImGuiStb::stb_textedit_clamp(this,state);
      iVar14 = (this->StbState).select_start;
      iVar18 = (this->StbState).select_end;
      if (iVar14 != iVar18) {
        if (iVar18 < iVar14) {
          (this->StbState).select_end = iVar14;
          (this->StbState).select_start = iVar18;
        }
        iVar14 = (this->StbState).select_start;
        (this->StbState).cursor = iVar14;
        (this->StbState).select_end = iVar14;
        (this->StbState).has_preferred_x = '\0';
      }
      if ((this->StbState).single_line != '\0') {
        state->cursor = 0;
        goto LAB_00144b8b;
      }
      if ((long)state->cursor < 1) goto LAB_00144b8b;
      puVar16 = (this->TextW).Data;
      lVar20 = (long)state->cursor;
      goto LAB_00144bbc;
    case 0x10005:
      iVar14 = this->CurLenW;
      ImGuiStb::stb_textedit_clamp(this,state);
      iVar18 = (this->StbState).select_start;
      iVar27 = (this->StbState).select_end;
      if (iVar18 != iVar27) {
        if (iVar27 < iVar18) {
          (this->StbState).select_end = iVar18;
          (this->StbState).select_start = iVar27;
        }
        iVar18 = (this->StbState).select_start;
        (this->StbState).cursor = iVar18;
        (this->StbState).select_end = iVar18;
        (this->StbState).has_preferred_x = '\0';
      }
      if ((this->StbState).single_line != '\0') {
        state->cursor = iVar14;
        goto LAB_00144b8b;
      }
      iVar18 = state->cursor;
      if (iVar14 <= iVar18) goto LAB_00144b8b;
      puVar16 = (this->TextW).Data + iVar18;
      goto LAB_00144bf2;
    case 0x10006:
      (this->StbState).select_end = 0;
      (this->StbState).cursor = 0;
      (this->StbState).select_start = 0;
      goto LAB_00144b8b;
    case 0x10007:
      (this->StbState).cursor = this->CurLenW;
      (this->StbState).select_start = 0;
      (this->StbState).select_end = 0;
      goto LAB_00144b8b;
    case 0x10008:
switchD_001441d3_caseD_10008:
      if ((this->StbState).select_start != (this->StbState).select_end) goto LAB_00144601;
      iVar14 = (this->StbState).cursor;
      if (iVar14 < this->CurLenW) {
        ImGuiStb::stb_textedit_delete(this,state,iVar14,1);
      }
      goto LAB_00144b8b;
    case 0x10009:
switchD_001441d3_caseD_10009:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        ImGuiStb::stb_textedit_clamp(this,state);
        iVar14 = (this->StbState).cursor;
        if (0 < iVar14) {
          ImGuiStb::stb_textedit_delete(this,state,iVar14 + -1,1);
          (this->StbState).cursor = (this->StbState).cursor + -1;
        }
      }
      else {
LAB_00144601:
        ImGuiStb::stb_textedit_delete_selection(this,state);
      }
      goto LAB_00144b8b;
    case 0x1000a:
      lVar20 = (long)(this->StbState).undostate.undo_point;
      if (lVar20 == 0) goto LAB_00144b8b;
      iVar14 = (this->StbState).undostate.undo_rec[lVar20 + -1].where;
      iVar18 = (this->StbState).undostate.undo_rec[lVar20 + -1].insert_length;
      uVar22 = (this->StbState).undostate.undo_rec[lVar20 + -1].delete_length;
      sVar3 = (this->StbState).undostate.redo_point;
      uVar25 = (ulong)sVar3;
      iVar27 = (this->StbState).undostate.undo_rec[lVar20 + -1].char_storage;
      (this->StbState).undostate.undo_rec[uVar25 - 1].char_storage = -1;
      (this->StbState).undostate.undo_rec[uVar25 - 1].insert_length = uVar22;
      (this->StbState).undostate.undo_rec[uVar25 - 1].delete_length = iVar18;
      (this->StbState).undostate.undo_rec[uVar25 - 1].where = iVar14;
      if ((ulong)uVar22 == 0) goto LAB_00144e70;
      iVar24 = (this->StbState).undostate.undo_char_point + uVar22;
      if (0x3e6 < iVar24) {
        (this->StbState).undostate.undo_rec[uVar25 - 1].insert_length = 0;
        goto LAB_00144e5d;
      }
      iVar13 = (this->StbState).undostate.redo_char_point;
      bVar12 = iVar13 < iVar24;
      if (iVar24 <= iVar13) goto LAB_00144e01;
      if (sVar3 == 99) goto LAB_00144b8b;
      local_50 = (ImGuiStb *)(this->StbState).undostate.undo_char;
      goto LAB_00144ca3;
    case 0x1000b:
      lVar20 = (long)(this->StbState).undostate.redo_point;
      if (lVar20 != 99) {
        sVar3 = (this->StbState).undostate.undo_point;
        iVar14 = (this->StbState).undostate.undo_rec[lVar20].where;
        iVar18 = (this->StbState).undostate.undo_rec[lVar20].insert_length;
        uVar22 = (this->StbState).undostate.undo_rec[lVar20].delete_length;
        iVar27 = (this->StbState).undostate.undo_rec[lVar20].char_storage;
        (this->StbState).undostate.undo_rec[sVar3].delete_length = iVar18;
        (this->StbState).undostate.undo_rec[sVar3].insert_length = uVar22;
        (this->StbState).undostate.undo_rec[sVar3].where = iVar14;
        (this->StbState).undostate.undo_rec[sVar3].char_storage = -1;
        if ((ulong)uVar22 != 0) {
          iVar24 = (this->StbState).undostate.undo_char_point;
          if ((this->StbState).undostate.redo_char_point < (int)(iVar24 + uVar22)) {
            pSVar10 = (this->StbState).undostate.undo_rec + sVar3;
            pSVar10->insert_length = 0;
            pSVar10->delete_length = 0;
          }
          else {
            (this->StbState).undostate.undo_rec[sVar3].char_storage = iVar24;
            (this->StbState).undostate.undo_char_point = iVar24 + uVar22;
            if (0 < (int)uVar22) {
              puVar16 = (this->TextW).Data;
              uVar25 = 0;
              do {
                (this->StbState).undostate.undo_char[(long)iVar24 + uVar25] =
                     puVar16[(long)iVar14 + uVar25];
                uVar25 = uVar25 + 1;
              } while (uVar22 != uVar25);
            }
          }
          ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,uVar22);
        }
        if (iVar18 != 0) {
          ImGuiStb::STB_TEXTEDIT_INSERTCHARS
                    (this,iVar14,(this->StbState).undostate.undo_char + iVar27,iVar18);
          piVar17 = &(this->StbState).undostate.redo_char_point;
          *piVar17 = *piVar17 + iVar18;
        }
        (this->StbState).cursor = iVar18 + iVar14;
        uVar5 = (this->StbState).undostate.undo_point;
        uVar7 = (this->StbState).undostate.redo_point;
        (this->StbState).undostate.undo_point = uVar5 + 1;
        (this->StbState).undostate.redo_point = uVar7 + 1;
      }
      goto LAB_00144b8b;
    case 0x1000c:
      iVar14 = (this->StbState).select_start;
      iVar18 = (this->StbState).select_end;
      if (iVar14 == iVar18) {
        uVar22 = state->cursor;
        uVar28 = (int)uVar22 >> 0x1f & uVar22;
        goto LAB_00144771;
      }
      if (iVar18 < iVar14) {
        (this->StbState).select_end = iVar14;
        (this->StbState).select_start = iVar18;
      }
      iVar14 = (this->StbState).select_start;
      (this->StbState).cursor = iVar14;
      goto LAB_00144b88;
    case 0x1000d:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        iVar14 = ImGuiStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->StbState).cursor);
        (this->StbState).cursor = iVar14;
        goto LAB_00144c26;
      }
      ImGuiStb::stb_textedit_move_to_last(this,state);
      goto LAB_00144b8f;
    default:
      switch(key) {
      case 0x30000:
        ImGuiStb::stb_textedit_clamp(this,state);
        iVar14 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar14) {
          iVar14 = (this->StbState).cursor;
          (this->StbState).select_end = iVar14;
          (this->StbState).select_start = iVar14;
        }
        else {
          state->cursor = iVar14;
        }
        iVar14 = (this->StbState).select_end;
        if (0 < iVar14) {
          (this->StbState).select_end = iVar14 + -1;
        }
        break;
      case 0x30001:
        iVar14 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar14) {
          iVar14 = (this->StbState).cursor;
          (this->StbState).select_end = iVar14;
          (this->StbState).select_start = iVar14;
        }
        else {
          state->cursor = iVar14;
        }
        piVar17 = &(this->StbState).select_end;
        *piVar17 = *piVar17 + 1;
        ImGuiStb::stb_textedit_clamp(this,state);
        break;
      case 0x30002:
        goto switchD_001441d3_caseD_10002;
      case 0x30003:
        goto switchD_001441d3_caseD_10003;
      case 0x30004:
        ImGuiStb::stb_textedit_clamp(this,state);
        iVar14 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar14) {
          iVar14 = (this->StbState).cursor;
          (this->StbState).select_end = iVar14;
          (this->StbState).select_start = iVar14;
        }
        else {
          state->cursor = iVar14;
        }
        if ((this->StbState).single_line != '\0') {
          state->cursor = 0;
          goto LAB_00144b85;
        }
        if ((long)state->cursor < 1) goto LAB_00144b85;
        puVar16 = (this->TextW).Data;
        lVar20 = (long)state->cursor;
        goto LAB_00144b35;
      case 0x30005:
        iVar14 = this->CurLenW;
        ImGuiStb::stb_textedit_clamp(this,state);
        iVar18 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar18) {
          iVar18 = (this->StbState).cursor;
          (this->StbState).select_end = iVar18;
          (this->StbState).select_start = iVar18;
        }
        else {
          state->cursor = iVar18;
        }
        if ((this->StbState).single_line != '\0') {
          state->cursor = iVar14;
          goto LAB_00144b85;
        }
        iVar18 = state->cursor;
        if (iVar14 <= iVar18) goto LAB_00144b85;
        puVar16 = (this->TextW).Data + iVar18;
        goto LAB_00144b6b;
      case 0x30006:
        iVar14 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar14) {
          iVar14 = (this->StbState).cursor;
          (this->StbState).select_end = iVar14;
          (this->StbState).select_start = iVar14;
        }
        else {
          state->cursor = iVar14;
        }
        iVar14 = 0;
        goto LAB_00144ab5;
      case 0x30007:
        iVar14 = (this->StbState).select_end;
        if ((this->StbState).select_start == iVar14) {
          iVar14 = (this->StbState).cursor;
          (this->StbState).select_end = iVar14;
          (this->StbState).select_start = iVar14;
        }
        else {
          state->cursor = iVar14;
        }
        iVar14 = this->CurLenW;
LAB_00144ab5:
        (this->StbState).select_end = iVar14;
        goto LAB_00144ab8;
      case 0x30008:
        goto switchD_001441d3_caseD_10008;
      case 0x30009:
        goto switchD_001441d3_caseD_10009;
      default:
        uVar22 = 0;
        if (key < 0x10000) {
          uVar22 = key;
        }
        if (((int)uVar22 < 1) ||
           ((local_48[0] = (ImWchar)uVar22, uVar22 == 10 && ((this->StbState).single_line != '\0')))
           ) goto LAB_00144b8f;
        if (((this->StbState).insert_mode == '\0') ||
           ((this->StbState).select_start != (this->StbState).select_end)) {
LAB_00144c30:
          ImGuiStb::stb_textedit_delete_selection(this,state);
          bVar12 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,local_48,1);
          if (!bVar12) goto LAB_00144b8f;
          ImGuiStb::stb_text_createundo(&(this->StbState).undostate,(this->StbState).cursor,0,1);
        }
        else {
          iVar14 = (this->StbState).cursor;
          if (this->CurLenW <= iVar14) goto LAB_00144c30;
          pIVar15 = ImGuiStb::stb_text_createundo(&(this->StbState).undostate,iVar14,1,1);
          if (pIVar15 != (ImWchar *)0x0) {
            *pIVar15 = (this->TextW).Data[iVar14];
          }
          ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,(this->StbState).cursor,1);
          bVar12 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,local_48,1);
          if (!bVar12) goto LAB_00144b8f;
        }
        (this->StbState).cursor = (this->StbState).cursor + 1;
        goto LAB_00144b8b;
      case 0x3000c:
        if ((this->StbState).select_start == (this->StbState).select_end) {
          iVar14 = (this->StbState).cursor;
          (this->StbState).select_end = iVar14;
          (this->StbState).select_start = iVar14;
        }
        uVar22 = state->cursor;
        uVar28 = (int)uVar22 >> 0x1f & uVar22;
        goto LAB_001446b0;
      case 0x3000d:
        if ((this->StbState).select_start == (this->StbState).select_end) {
          iVar14 = (this->StbState).cursor;
          (this->StbState).select_end = iVar14;
          (this->StbState).select_start = iVar14;
        }
        iVar14 = this->CurLenW;
        iVar18 = (this->StbState).cursor;
        iVar27 = iVar18 + 1;
        if (iVar18 + 1 < iVar14) {
          iVar27 = iVar14;
        }
        goto LAB_0014470a;
      }
      iVar14 = (this->StbState).select_end;
LAB_00144ab8:
      (this->StbState).cursor = iVar14;
      goto LAB_00144b8b;
    }
  } while (uVar2 != '\0');
  goto LAB_00144b8f;
  while (iVar13 = ImGuiStb::is_word_boundary_from_right(this,iVar18), iVar24 = iVar18, iVar13 == 0)
  {
LAB_0014470a:
    iVar18 = iVar18 + 1;
    iVar24 = iVar27;
    if (iVar14 <= iVar18) break;
  }
  if (iVar24 < iVar14) {
    iVar14 = iVar24;
  }
  (this->StbState).cursor = iVar14;
  (this->StbState).select_end = iVar14;
  goto LAB_00144c26;
  while( true ) {
    uVar22 = uVar22 - 1;
    iVar14 = ImGuiStb::is_word_boundary_from_right(this,uVar22);
    uVar23 = uVar22;
    if (iVar14 != 0) break;
LAB_001446b0:
    uVar23 = uVar28 - 1;
    if ((int)uVar22 < 1) break;
  }
  uVar22 = 0;
  if (0 < (int)uVar23) {
    uVar22 = uVar23;
  }
  (this->StbState).cursor = uVar22;
  (this->StbState).select_end = uVar22;
  goto LAB_00144c26;
  while( true ) {
    state->cursor = iVar18;
    puVar16 = puVar16 + 1;
    if (iVar18 == iVar14) break;
LAB_00144b6b:
    iVar18 = iVar18 + 1;
    if (*puVar16 == 10) break;
  }
  goto LAB_00144b85;
  while( true ) {
    state->cursor = (int)lVar20 + -1;
    bVar12 = lVar20 < 2;
    lVar20 = lVar20 + -1;
    if (bVar12) break;
LAB_00144b35:
    if (puVar16[lVar20 + -1] == 10) break;
  }
LAB_00144b85:
  iVar14 = (this->StbState).cursor;
LAB_00144b88:
  (this->StbState).select_end = iVar14;
  goto LAB_00144b8b;
  while( true ) {
    uVar22 = uVar22 - 1;
    iVar14 = ImGuiStb::is_word_boundary_from_right(this,uVar22);
    uVar23 = uVar22;
    if (iVar14 != 0) break;
LAB_00144771:
    uVar23 = uVar28 - 1;
    if ((int)uVar22 < 1) break;
  }
  uVar22 = 0;
  if (0 < (int)uVar23) {
    uVar22 = uVar23;
  }
  (this->StbState).cursor = uVar22;
LAB_00144c26:
  ImGuiStb::stb_textedit_clamp(this,state);
  goto LAB_00144b8f;
  while (uVar4 = (this->StbState).undostate.redo_point, uVar25 = (ulong)uVar4, uVar4 != 99) {
LAB_00144ca3:
    if ((short)uVar25 < 99) {
      if (-1 < (this->StbState).undostate.undo_rec[0x62].char_storage) {
        iVar24 = (this->StbState).undostate.undo_rec[0x62].insert_length;
        lVar20 = (long)(this->StbState).undostate.redo_char_point + (long)iVar24;
        iVar13 = (int)lVar20;
        (this->StbState).undostate.redo_char_point = iVar13;
        memmove(local_50 + lVar20 * 2,local_50 + lVar20 * 2 + (long)iVar24 * -2,
                (long)(999 - iVar13) * 2);
        lVar20 = (long)(this->StbState).undostate.redo_point;
        if (lVar20 < 0x62) {
          lVar21 = lVar20 + -0x62;
          piVar17 = &(this->StbState).undostate.undo_rec[lVar20].char_storage;
          do {
            if (-1 < *piVar17) {
              *piVar17 = *piVar17 + iVar24;
            }
            piVar17 = piVar17 + 4;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0);
        }
      }
      lVar20 = (long)(this->StbState).undostate.redo_point;
      memmove((this->StbState).undostate.undo_rec + lVar20 + 1,
              (this->StbState).undostate.undo_rec + lVar20,lVar20 * -0x10 + 0x630);
      psVar1 = &(this->StbState).undostate.redo_point;
      *psVar1 = *psVar1 + 1;
    }
    iVar24 = (this->StbState).undostate.undo_char_point + uVar22;
    iVar13 = (this->StbState).undostate.redo_char_point;
    bVar12 = iVar13 < iVar24;
    if (iVar24 <= iVar13) goto LAB_00144e01;
  }
  goto LAB_00144b8b;
LAB_00144e01:
  (this->StbState).undostate.undo_rec[(long)(this->StbState).undostate.redo_point + -1].char_storage
       = iVar13 - uVar22;
  (this->StbState).undostate.redo_char_point = iVar13 - uVar22;
  if (0 < (int)uVar22) {
    puVar16 = (this->TextW).Data;
    uVar25 = 0;
    do {
      *(unsigned_short *)
       ((long)this + uVar25 * 2 + (long)iVar13 * 2 + (long)(int)uVar22 * -2 + 0x690) =
           puVar16[(long)iVar14 + uVar25];
      uVar25 = uVar25 + 1;
    } while (uVar22 != uVar25);
  }
  if (!bVar12) {
LAB_00144e5d:
    ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,uVar22);
LAB_00144e70:
    if (iVar18 != 0) {
      ImGuiStb::STB_TEXTEDIT_INSERTCHARS
                (this,iVar14,(this->StbState).undostate.undo_char + iVar27,iVar18);
      piVar17 = &(this->StbState).undostate.undo_char_point;
      *piVar17 = *piVar17 - iVar18;
    }
    (this->StbState).cursor = iVar18 + iVar14;
    uVar6 = (this->StbState).undostate.undo_point;
    uVar8 = (this->StbState).undostate.redo_point;
    (this->StbState).undostate.undo_point = uVar6 + -1;
    (this->StbState).undostate.redo_point = uVar8 + -1;
  }
  goto LAB_00144b8b;
  while( true ) {
    state->cursor = iVar18;
    puVar16 = puVar16 + 1;
    if (iVar18 == iVar14) break;
LAB_00144bf2:
    iVar18 = iVar18 + 1;
    if (*puVar16 == 10) break;
  }
  goto LAB_00144b8b;
  while( true ) {
    state->cursor = (int)lVar20 + -1;
    bVar12 = lVar20 < 2;
    lVar20 = lVar20 + -1;
    if (bVar12) break;
LAB_00144bbc:
    if (puVar16[lVar20 + -1] == 10) break;
  }
LAB_00144b8b:
  (this->StbState).has_preferred_x = '\0';
LAB_00144b8f:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &StbState, key);
    CursorFollow = true;
    CursorAnimReset();
}